

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O0

void HandleMbxTferReqError
               (CAtEmLogging *poLog,EC_T_CHAR *szErrMsg,EC_T_DWORD dwErrorCode,
               EC_T_MBXTFER *pMbxTfer)

{
  undefined8 uVar1;
  int local_2c;
  EC_T_DWORD dwWorstCaseTimeout;
  EC_T_MBXTFER *pMbxTfer_local;
  EC_T_DWORD dwErrorCode_local;
  EC_T_CHAR *szErrMsg_local;
  CAtEmLogging *poLog_local;
  
  for (local_2c = 10; pMbxTfer->eTferStatus == eMbxTferStatus_Pend && local_2c != 0;
      local_2c = local_2c + -1) {
    CAtEmLogging::LogError(poLog,"%s: waiting for mailbox transfer response",szErrMsg);
    LinuxSleep(2000);
  }
  if (pMbxTfer->eTferStatus == eMbxTferStatus_Pend) {
    CAtEmLogging::LogError(poLog,"%s: timeout waiting for mailbox transfer response",szErrMsg);
  }
  else if (dwErrorCode != 0) {
    uVar1 = ecatGetText(dwErrorCode);
    CAtEmLogging::LogError
              (poLog,"%s: MbxTferReqError: %s (0x%lx)",szErrMsg,uVar1,(ulong)dwErrorCode);
  }
  return;
}

Assistant:

EC_T_VOID HandleMbxTferReqError
    (CAtEmLogging* poLog
    ,EC_T_CHAR*    szErrMsg      /**< [in] error message */
    ,EC_T_DWORD    dwErrorCode   /**< [in] basic error code */
    ,EC_T_MBXTFER* pMbxTfer)     /**< [in] mbx transfer object */
{
    /* wait for MbxTfer completion, but let application finish if master never returns MbxTfer object (may happen using RAS) */
    {
        EC_T_DWORD dwWorstCaseTimeout = 10;

        /*
         * Wait if MbxTfer still running and MbxTfer object owned by master.
         * Cannot re-use MbxTfer object while state is eMbxTferStatus_Pend.
         */
        for (dwWorstCaseTimeout = 10; (eMbxTferStatus_Pend == pMbxTfer->eTferStatus) && (dwWorstCaseTimeout > 0); dwWorstCaseTimeout--)
        {
            LogErr("%s: waiting for mailbox transfer response", szErrMsg);
            OsSleep(2000);
        }

        if (eMbxTferStatus_Pend == pMbxTfer->eTferStatus)
        {
            LogErr("%s: timeout waiting for mailbox transfer response", szErrMsg);
            goto Exit;
        }
    }

    if (EC_E_NOERROR != dwErrorCode)
    {
        LogErr("%s: MbxTferReqError: %s (0x%lx)", szErrMsg, ecatGetText(dwErrorCode), dwErrorCode);
    }

Exit:
    return;
}